

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_state_machine.cc
# Opt level: O0

void __thiscall
state_machine_on_exit_state_sm_dtor_Test::TestBody(state_machine_on_exit_state_sm_dtor_Test *this)

{
  anon_class_1_0_00000001 *this_00;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_a8;
  Message local_a0;
  int local_94;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_2;
  Message local_78;
  int local_6c;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_1;
  StateMachine<state_machine::transition::Table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<s4>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(anonymous_namespace)::return_s2,_state_machine::transition::State<(anonymous_namespace)::s2>_>_>_>_>_conflict
  sm;
  Message local_48 [3];
  int local_2c;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  anon_class_1_0_00000001 generate_table;
  state_machine_on_exit_state_sm_dtor_Test *this_local;
  
  local_2c = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_28,"on_exit_count","0",&TestBody::on_exit_count,&local_2c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_state_machine.cc"
               ,0x91,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffffb0,local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffb0);
    testing::Message::~Message(local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  this_00 = (anon_class_1_0_00000001 *)
            ((long)&gtest_ar_1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 4);
  TestBody::anon_class_1_0_00000001::operator()(this_00);
  state_machine::state_machine::
  StateMachine<state_machine::transition::Table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<s4>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(anonymous_namespace)::return_s2,_state_machine::transition::State<(anonymous_namespace)::s2>_>_>_>_>
  ::StateMachine<>((StateMachine<state_machine::transition::Table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<s4>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(anonymous_namespace)::return_s2,_state_machine::transition::State<(anonymous_namespace)::s2>_>_>_>_>
                    *)((long)&gtest_ar_1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      + 5),(Table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<s4>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(anonymous_namespace)::return_s2,_state_machine::transition::State<(anonymous_namespace)::s2>_>_>_>
                            *)this_00);
  local_6c = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_68,"on_exit_count","0",&TestBody::on_exit_count,&local_6c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_state_machine.cc"
               ,0x93,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  state_machine::state_machine::
  StateMachine<state_machine::transition::Table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<s4>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(anonymous_namespace)::return_s2,_state_machine::transition::State<(anonymous_namespace)::s2>_>_>_>_>
  ::~StateMachine((StateMachine<state_machine::transition::Table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<s4>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(anonymous_namespace)::return_s2,_state_machine::transition::State<(anonymous_namespace)::s2>_>_>_>_>
                   *)((long)&gtest_ar_1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 5));
  local_94 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_90,"on_exit_count","1",&TestBody::on_exit_count,&local_94);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_state_machine.cc"
               ,0x95,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  return;
}

Assistant:

TEST(state_machine, on_exit_state_sm_dtor) {
    static int on_exit_count;

    struct s4 {
        constexpr s4() = default;

        // NOLINTNEXTLINE(readability-convert-member-functions-to-static)
        auto on_exit() -> void { on_exit_count++; }
    };

    const auto generate_table = []() noexcept {
        return make_table_from_transition_args(state<s4>, event<e2>, _, return_s2{}, state<s2>);
    };


    {
        EXPECT_EQ(on_exit_count, 0);
        StateMachine<decltype(generate_table())> sm{generate_table()};
        EXPECT_EQ(on_exit_count, 0);
    }
    EXPECT_EQ(on_exit_count, 1);
}